

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumber.cpp
# Opt level: O2

int32 Js::JavascriptNumber::GetNonzeroInt32Value_NoTaggedIntCheck(Var object)

{
  code *pcVar1;
  bool bVar2;
  int32 iVar3;
  undefined4 *puVar4;
  double value;
  int32 local_1c [2];
  int32 i;
  
  if (object == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                ,0xa4,"(object)","object");
    if (!bVar2) goto LAB_00b8a5d1;
    *puVar4 = 0;
  }
  bVar2 = TaggedInt::Is(object);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                ,0xa5,"(!TaggedInt::Is(object))","!TaggedInt::Is(object)");
    if (!bVar2) {
LAB_00b8a5d1:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  iVar3 = 0;
  if ((ulong)object >> 0x32 != 0) {
    value = GetValue(object);
    bVar2 = TryGetInt32Value<false>(value,local_1c);
    iVar3 = 0;
    if (bVar2) {
      iVar3 = local_1c[0];
    }
  }
  return iVar3;
}

Assistant:

int32 JavascriptNumber::GetNonzeroInt32Value_NoTaggedIntCheck(const Var object)
    {
        Assert(object);
        Assert(!TaggedInt::Is(object));

        int32 i;
        return Is_NoTaggedIntCheck(object) && TryGetInt32Value(GetValue(object), &i) ? i : 0;
    }